

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlagsy.c
# Opt level: O0

int zlagsy_slu(int *n,int *k,double *d,doublecomplex *a,int *lda,int *iseed,doublecomplex *work,
              int *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  doublereal dVar6;
  double dVar7;
  int local_c8;
  undefined1 local_c0 [8];
  doublecomplex z__4;
  doublecomplex z__3;
  doublecomplex z__2;
  doublecomplex z__1;
  double d__1;
  int i__9;
  int i__8;
  int i__7;
  int i__6;
  int i__5;
  int i__4;
  int i__3;
  int i__2;
  int i__1;
  int a_offset;
  int a_dim1;
  int *iseed_local;
  int *lda_local;
  doublecomplex *a_local;
  double *d_local;
  int *k_local;
  int *n_local;
  
  a_local = (doublecomplex *)(d + -1);
  i__1 = *lda;
  i__2 = i__1 + 1;
  lda_local = (int *)(a + -(long)i__2);
  _a_offset = iseed + -1;
  *info = 0;
  if (*n < 0) {
    *info = -1;
  }
  else if ((*k < 0) || (*n + -1 < *k)) {
    *info = -2;
  }
  else {
    if (*n < 1) {
      local_c8 = 1;
    }
    else {
      local_c8 = *n;
    }
    if (*lda < local_c8) {
      *info = -5;
    }
  }
  iseed_local = lda;
  d_local = (double *)k;
  k_local = n;
  if (*info < 0) {
    i__3 = -*info;
    input_error("ZLAGSY",&i__3);
  }
  else {
    iVar4 = *n;
    for (zlagsy_slu::j = 1; zlagsy_slu::j <= iVar4; zlagsy_slu::j = zlagsy_slu::j + 1) {
      i__4 = *n;
      zlagsy_slu::i = zlagsy_slu::j;
      while (zlagsy_slu::i = zlagsy_slu::i + 1, zlagsy_slu::i <= i__4) {
        i__5 = zlagsy_slu::i + zlagsy_slu::j * i__1;
        ((doublecomplex *)((long)lda_local + (long)i__5 * 0x10))->r = 0.0;
        ((doublecomplex *)((long)lda_local + (long)i__5 * 0x10))->i = 0.0;
      }
    }
    iVar4 = *n;
    for (zlagsy_slu::i = 1; zlagsy_slu::i <= iVar4; zlagsy_slu::i = zlagsy_slu::i + 1) {
      i__4 = zlagsy_slu::i + zlagsy_slu::i * i__1;
      i__5 = zlagsy_slu::i;
      ((doublecomplex *)((long)lda_local + (long)i__4 * 0x10))->r = (&a_local->r)[zlagsy_slu::i];
      ((doublecomplex *)((long)lda_local + (long)i__4 * 0x10))->i = 0.0;
    }
    zlagsy_slu::i = *n;
    while (zlagsy_slu::i = zlagsy_slu::i + -1, 0 < zlagsy_slu::i) {
      i__3 = (*k_local - zlagsy_slu::i) + 1;
      zlarnv_slu(&c__3,_a_offset + 1,&i__3,work);
      i__3 = (*k_local - zlagsy_slu::i) + 1;
      dVar6 = dznrm2_(&i__3,work,&c__1);
      zlagsy_slu::wn = dVar6;
      dVar7 = z_abs(work);
      zlagsy_slu::wa.r = (dVar6 / dVar7) * work->r;
      zlagsy_slu::wa.i = (dVar6 / dVar7) * work->i;
      if ((zlagsy_slu::wn != 0.0) || (NAN(zlagsy_slu::wn))) {
        zlagsy_slu::wb.r = work->r + zlagsy_slu::wa.r;
        zlagsy_slu::wb.i = work->i + zlagsy_slu::wa.i;
        i__3 = *k_local - zlagsy_slu::i;
        z__2.i = zlagsy_slu::wb.r;
        z_div((doublecomplex *)&z__2.i,&c_b2,&zlagsy_slu::wb);
        zscal_(&i__3,(doublecomplex *)&z__2.i,work + 1,&c__1);
        work->r = 1.0;
        work->i = 0.0;
        z_div((doublecomplex *)&z__2.i,&zlagsy_slu::wb,&zlagsy_slu::wa);
        zlagsy_slu::tau.r = z__2.i;
      }
      else {
        zlagsy_slu::tau.r = 0.0;
        z__2.i = zlagsy_slu::wa.r;
      }
      zlagsy_slu::tau.i = 0.0;
      i__3 = (*k_local - zlagsy_slu::i) + 1;
      zlacgv_slu(&i__3,work,&c__1);
      i__3 = (*k_local - zlagsy_slu::i) + 1;
      zsymv_("Lower",&i__3,&zlagsy_slu::tau,
             (doublecomplex *)(lda_local + (long)(zlagsy_slu::i + zlagsy_slu::i * i__1) * 4),
             iseed_local,work,&c__1,&c_b1,work + (long)(*k_local + 1) + -1,&c__1);
      i__3 = (*k_local - zlagsy_slu::i) + 1;
      zlacgv_slu(&i__3,work,&c__1);
      z__4.i = -0.5;
      dVar7 = zlagsy_slu::tau.r * -0.5 + -(zlagsy_slu::tau.i * 0.0);
      z__2.r = zlagsy_slu::tau.i * -0.5 + zlagsy_slu::tau.r * 0.0;
      i__3 = (*k_local - zlagsy_slu::i) + 1;
      zdotc_((doublecomplex *)local_c0,&i__3,work,&c__1,work + (long)(*k_local + 1) + -1,&c__1);
      zlagsy_slu::alpha.r = dVar7 * (double)local_c0 + -(z__2.r * z__4.r);
      zlagsy_slu::alpha.i = dVar7 * z__4.r + z__2.r * (double)local_c0;
      i__3 = (*k_local - zlagsy_slu::i) + 1;
      z__2.i = zlagsy_slu::alpha.r;
      zaxpy_(&i__3,&zlagsy_slu::alpha,work,&c__1,work + (long)(*k_local + 1) + -1,&c__1);
      iVar4 = *k_local;
      for (zlagsy_slu::jj = zlagsy_slu::i; zlagsy_slu::jj <= iVar4;
          zlagsy_slu::jj = zlagsy_slu::jj + 1) {
        i__4 = *k_local;
        for (zlagsy_slu::ii = zlagsy_slu::jj; zlagsy_slu::ii <= i__4;
            zlagsy_slu::ii = zlagsy_slu::ii + 1) {
          i__5 = zlagsy_slu::ii + zlagsy_slu::jj * i__1;
          iVar1 = zlagsy_slu::ii + zlagsy_slu::jj * i__1;
          iVar2 = (zlagsy_slu::ii - zlagsy_slu::i) + 1;
          iVar3 = ((*k_local + zlagsy_slu::jj) - zlagsy_slu::i) + 1;
          z__4.i = work[(long)iVar2 + -1].r * work[(long)iVar3 + -1].r +
                   -(work[(long)iVar2 + -1].i * work[(long)iVar3 + -1].i);
          z__2.r = *(double *)(lda_local + (long)iVar1 * 4 + 2) -
                   (work[(long)iVar2 + -1].r * work[(long)iVar3 + -1].i +
                   work[(long)iVar2 + -1].i * work[(long)iVar3 + -1].r);
          iVar2 = ((*k_local + zlagsy_slu::ii) - zlagsy_slu::i) + 1;
          iVar3 = (zlagsy_slu::jj - zlagsy_slu::i) + 1;
          local_c0 = (undefined1  [8])
                     (work[(long)iVar2 + -1].r * work[(long)iVar3 + -1].r +
                     -(work[(long)iVar2 + -1].i * work[(long)iVar3 + -1].i));
          z__4.r = work[(long)iVar2 + -1].r * work[(long)iVar3 + -1].i +
                   work[(long)iVar2 + -1].i * work[(long)iVar3 + -1].r;
          z__2.i = (*(double *)(lda_local + (long)iVar1 * 4) - z__4.i) - (double)local_c0;
          *(double *)(lda_local + (long)i__5 * 4) = z__2.i;
          *(double *)(lda_local + (long)i__5 * 4 + 2) = z__2.r - z__4.r;
        }
      }
    }
    i__3 = (*k_local + -1) - *(int *)d_local;
    for (zlagsy_slu::i = 1; zlagsy_slu::i <= i__3; zlagsy_slu::i = zlagsy_slu::i + 1) {
      i__4 = ((*k_local - *(int *)d_local) - zlagsy_slu::i) + 1;
      dVar6 = dznrm2_(&i__4,(doublecomplex *)
                            (lda_local +
                            (long)(*(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1) * 4),
                      &c__1);
      zlagsy_slu::wn = dVar6;
      dVar7 = z_abs((doublecomplex *)
                    (lda_local + (long)(*(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1) * 4)
                   );
      iVar4 = *(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1;
      zlagsy_slu::wa.r = (dVar6 / dVar7) * *(double *)(lda_local + (long)iVar4 * 4);
      zlagsy_slu::wa.i = (dVar6 / dVar7) * *(double *)(lda_local + (long)iVar4 * 4 + 2);
      if ((zlagsy_slu::wn != 0.0) || (NAN(zlagsy_slu::wn))) {
        iVar4 = *(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1;
        zlagsy_slu::wb.r = *(double *)(lda_local + (long)iVar4 * 4) + zlagsy_slu::wa.r;
        zlagsy_slu::wb.i = *(double *)(lda_local + (long)iVar4 * 4 + 2) + zlagsy_slu::wa.i;
        i__4 = (*k_local - *(int *)d_local) - zlagsy_slu::i;
        z__2.i = zlagsy_slu::wb.r;
        z_div((doublecomplex *)&z__2.i,&c_b2,&zlagsy_slu::wb);
        zscal_(&i__4,(doublecomplex *)&z__2.i,
               (doublecomplex *)
               (lda_local + (long)(*(int *)d_local + zlagsy_slu::i + 1 + zlagsy_slu::i * i__1) * 4),
               &c__1);
        i__4 = *(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1;
        (lda_local + (long)i__4 * 4)[0] = 0;
        (lda_local + (long)i__4 * 4)[1] = 0x3ff00000;
        (lda_local + (long)i__4 * 4 + 2)[0] = 0;
        (lda_local + (long)i__4 * 4 + 2)[1] = 0;
        z_div((doublecomplex *)&z__2.i,&zlagsy_slu::wb,&zlagsy_slu::wa);
        zlagsy_slu::tau.r = z__2.i;
      }
      else {
        zlagsy_slu::tau.r = 0.0;
        z__2.i = zlagsy_slu::wa.r;
      }
      zlagsy_slu::tau.i = 0.0;
      i__4 = ((*k_local - *(int *)d_local) - zlagsy_slu::i) + 1;
      i__5 = *(int *)d_local + -1;
      zgemv_("Conjugate transpose",&i__4,&i__5,&c_b2,
             (doublecomplex *)
             (lda_local + (long)(*(int *)d_local + zlagsy_slu::i + (zlagsy_slu::i + 1) * i__1) * 4),
             iseed_local,
             (doublecomplex *)
             (lda_local + (long)(*(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1) * 4),&c__1,
             &c_b1,work,&c__1);
      i__4 = ((*k_local - *(int *)d_local) - zlagsy_slu::i) + 1;
      i__5 = *(int *)d_local + -1;
      z__2.i = -zlagsy_slu::tau.r;
      zgerc_(&i__4,&i__5,(doublecomplex *)&z__2.i,
             (doublecomplex *)
             (lda_local + (long)(*(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1) * 4),&c__1,
             work,&c__1,
             (doublecomplex *)
             (lda_local + (long)(*(int *)d_local + zlagsy_slu::i + (zlagsy_slu::i + 1) * i__1) * 4),
             iseed_local);
      i__4 = ((*k_local - *(int *)d_local) - zlagsy_slu::i) + 1;
      zlacgv_slu(&i__4,(doublecomplex *)
                       (lda_local +
                       (long)(*(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1) * 4),&c__1);
      i__4 = ((*k_local - *(int *)d_local) - zlagsy_slu::i) + 1;
      zsymv_("Lower",&i__4,&zlagsy_slu::tau,
             (doublecomplex *)
             (lda_local +
             (long)(*(int *)d_local + zlagsy_slu::i + (*(int *)d_local + zlagsy_slu::i) * i__1) * 4)
             ,iseed_local,
             (doublecomplex *)
             (lda_local + (long)(*(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1) * 4),&c__1,
             &c_b1,work,&c__1);
      i__4 = ((*k_local - *(int *)d_local) - zlagsy_slu::i) + 1;
      zlacgv_slu(&i__4,(doublecomplex *)
                       (lda_local +
                       (long)(*(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1) * 4),&c__1);
      z__4.i = -0.5;
      dVar7 = zlagsy_slu::tau.r * -0.5 + -(zlagsy_slu::tau.i * 0.0);
      z__2.r = zlagsy_slu::tau.i * -0.5 + zlagsy_slu::tau.r * 0.0;
      i__4 = ((*k_local - *(int *)d_local) - zlagsy_slu::i) + 1;
      zdotc_((doublecomplex *)local_c0,&i__4,
             (doublecomplex *)
             (lda_local + (long)(*(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1) * 4),&c__1,
             work,&c__1);
      zlagsy_slu::alpha.r = dVar7 * (double)local_c0 + -(z__2.r * z__4.r);
      zlagsy_slu::alpha.i = dVar7 * z__4.r + z__2.r * (double)local_c0;
      i__4 = ((*k_local - *(int *)d_local) - zlagsy_slu::i) + 1;
      z__2.i = zlagsy_slu::alpha.r;
      zaxpy_(&i__4,&zlagsy_slu::alpha,
             (doublecomplex *)
             (lda_local + (long)(*(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1) * 4),&c__1,
             work,&c__1);
      iVar4 = *k_local;
      for (zlagsy_slu::jj = *(int *)d_local + zlagsy_slu::i; zlagsy_slu::jj <= iVar4;
          zlagsy_slu::jj = zlagsy_slu::jj + 1) {
        i__5 = *k_local;
        for (zlagsy_slu::ii = zlagsy_slu::jj; zlagsy_slu::ii <= i__5;
            zlagsy_slu::ii = zlagsy_slu::ii + 1) {
          iVar1 = zlagsy_slu::ii + zlagsy_slu::jj * i__1;
          iVar2 = zlagsy_slu::ii + zlagsy_slu::jj * i__1;
          iVar3 = zlagsy_slu::ii + zlagsy_slu::i * i__1;
          iVar5 = ((zlagsy_slu::jj - *(int *)d_local) - zlagsy_slu::i) + 1;
          z__4.i = *(double *)(lda_local + (long)iVar3 * 4) * work[(long)iVar5 + -1].r +
                   -(*(double *)(lda_local + (long)iVar3 * 4 + 2) * work[(long)iVar5 + -1].i);
          z__2.r = *(double *)(lda_local + (long)iVar2 * 4 + 2) -
                   (*(double *)(lda_local + (long)iVar3 * 4) * work[(long)iVar5 + -1].i +
                   *(double *)(lda_local + (long)iVar3 * 4 + 2) * work[(long)iVar5 + -1].r);
          iVar3 = ((zlagsy_slu::ii - *(int *)d_local) - zlagsy_slu::i) + 1;
          iVar5 = zlagsy_slu::jj + zlagsy_slu::i * i__1;
          local_c0 = (undefined1  [8])
                     (work[(long)iVar3 + -1].r * *(double *)(lda_local + (long)iVar5 * 4) +
                     -(work[(long)iVar3 + -1].i * *(double *)(lda_local + (long)iVar5 * 4 + 2)));
          z__4.r = work[(long)iVar3 + -1].r * *(double *)(lda_local + (long)iVar5 * 4 + 2) +
                   work[(long)iVar3 + -1].i * *(double *)(lda_local + (long)iVar5 * 4);
          *(double *)(lda_local + (long)iVar1 * 4) =
               (*(double *)(lda_local + (long)iVar2 * 4) - z__4.i) - (double)local_c0;
          *(double *)(lda_local + (long)iVar1 * 4 + 2) = z__2.r - z__4.r;
        }
      }
      iVar4 = *(int *)d_local + zlagsy_slu::i + zlagsy_slu::i * i__1;
      z__2.i = -zlagsy_slu::wa.r;
      dVar7 = -zlagsy_slu::wa.i;
      *(double *)(lda_local + (long)iVar4 * 4) = z__2.i;
      *(double *)(lda_local + (long)iVar4 * 4 + 2) = dVar7;
      iVar4 = *k_local;
      zlagsy_slu::j = *(int *)d_local + zlagsy_slu::i;
      while (zlagsy_slu::j = zlagsy_slu::j + 1, zlagsy_slu::j <= iVar4) {
        i__5 = zlagsy_slu::j + zlagsy_slu::i * i__1;
        (lda_local + (long)i__5 * 4)[0] = 0;
        (lda_local + (long)i__5 * 4)[1] = 0;
        (lda_local + (long)i__5 * 4 + 2)[0] = 0;
        (lda_local + (long)i__5 * 4 + 2)[1] = 0;
      }
    }
    iVar4 = *k_local;
    for (zlagsy_slu::j = 1; zlagsy_slu::j <= iVar4; zlagsy_slu::j = zlagsy_slu::j + 1) {
      iVar1 = *k_local;
      zlagsy_slu::i = zlagsy_slu::j;
      while (zlagsy_slu::i = zlagsy_slu::i + 1, zlagsy_slu::i <= iVar1) {
        iVar2 = zlagsy_slu::j + zlagsy_slu::i * i__1;
        iVar3 = zlagsy_slu::i + zlagsy_slu::j * i__1;
        *(undefined8 *)(lda_local + (long)iVar2 * 4) = *(undefined8 *)(lda_local + (long)iVar3 * 4);
        *(undefined8 *)(lda_local + (long)iVar2 * 4 + 2) =
             *(undefined8 *)(lda_local + (long)iVar3 * 4 + 2);
      }
    }
  }
  return 0;
}

Assistant:

int zlagsy_slu(int *n, int *k, double *d,
	doublecomplex *a, int *lda, int *iseed, doublecomplex *work,
	int *info)
{
    /* System generated locals */
    int a_dim1, a_offset, i__1, i__2, i__3, i__4, i__5, i__6, i__7, i__8,
	    i__9;
    double d__1;
    doublecomplex z__1, z__2, z__3, z__4;

    /* Local variables */
    static int i, j;
    static doublecomplex alpha;
    extern /* Subroutine */ int zgerc_(int *, int *, doublecomplex *,
	    doublecomplex *, int *, doublecomplex *, int *,
	    doublecomplex *, int *), zscal_(int *, doublecomplex *,
	    doublecomplex *, int *);
    extern /* Double Complex */ void zdotc_(doublecomplex *, int *,
	    doublecomplex *, int *, doublecomplex *, int *);
    extern /* Subroutine */ int	zsymv_(char *, int *,
	    doublecomplex *, doublecomplex *, int *, doublecomplex *,
	    int *, doublecomplex *, doublecomplex *, int *);
    extern double dznrm2_(int *, doublecomplex *, int *);
    static int ii, jj;
    static doublecomplex wa, wb;
    static double wn;
    extern /* Subroutine */ int zlacgv_slu(int *, doublecomplex *, int *), zlarnv_slu(int *,
	    int *, int *, doublecomplex *);
    extern int input_error(char *, int *);
    static doublecomplex tau;


/*  -- LAPACK auxiliary test routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

    ZLAGSY generates a complex symmetric matrix A, by pre- and post-   
    multiplying a real diagonal matrix D with a random unitary matrix:   
    A = U*D*U**T. The semi-bandwidth may then be reduced to k by   
    additional unitary transformations.   

    Arguments   
    =========   

    N       (input) INTEGER   
            The order of the matrix A.  N >= 0.   

    K       (input) INTEGER   
            The number of nonzero subdiagonals within the band of A.   
            0 <= K <= N-1.   

    D       (input) DOUBLE PRECISION array, dimension (N)   
            The diagonal elements of the diagonal matrix D.   

    A       (output) COMPLEX*16 array, dimension (LDA,N)   
            The generated n by n symmetric matrix A (the full matrix is   
            stored).   

    LDA     (input) INTEGER   
            The leading dimension of the array A.  LDA >= N.   

    ISEED   (input/output) INTEGER array, dimension (4)   
            On entry, the seed of the random number generator; the array 
  
            elements must be between 0 and 4095, and ISEED(4) must be   
            odd.   
            On exit, the seed is updated.   

    WORK    (workspace) COMPLEX*16 array, dimension (2*N)   

    INFO    (output) INTEGER   
            = 0: successful exit   
            < 0: if INFO = -i, the i-th argument had an illegal value   

    ===================================================================== 
  


       Test the input arguments   

       Parameter adjustments */
    --d;
    a_dim1 = *lda;
    a_offset = a_dim1 + 1;
    a -= a_offset;
    --iseed;
    --work;

    /* Function Body */
    *info = 0;
    if (*n < 0) {
	*info = -1;
    } else if (*k < 0 || *k > *n - 1) {
	*info = -2;
    } else if (*lda < SUPERLU_MAX(1,*n)) {
	*info = -5;
    }
    if (*info < 0) {
	i__1 = -(*info);
	input_error("ZLAGSY", &i__1);
	return 0;
    }

/*     initialize lower triangle of A to diagonal matrix */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i = j + 1; i <= i__2; ++i) {
	    i__3 = i + j * a_dim1;
	    a[i__3].r = 0., a[i__3].i = 0.;
/* L10: */
	}
/* L20: */
    }
    i__1 = *n;
    for (i = 1; i <= i__1; ++i) {
	i__2 = i + i * a_dim1;
	i__3 = i;
	a[i__2].r = d[i__3], a[i__2].i = 0.;
/* L30: */
    }

/*     Generate lower triangle of symmetric matrix */

    for (i = *n - 1; i >= 1; --i) {

/*        generate random reflection */

	i__1 = *n - i + 1;
	zlarnv_slu(&c__3, &iseed[1], &i__1, &work[1]);
	i__1 = *n - i + 1;
	wn = dznrm2_(&i__1, &work[1], &c__1);
	d__1 = wn / z_abs(&work[1]);
	z__1.r = d__1 * work[1].r, z__1.i = d__1 * work[1].i;
	wa.r = z__1.r, wa.i = z__1.i;
	if (wn == 0.) {
	    tau.r = 0., tau.i = 0.;
	} else {
	    z__1.r = work[1].r + wa.r, z__1.i = work[1].i + wa.i;
	    wb.r = z__1.r, wb.i = z__1.i;
	    i__1 = *n - i;
	    z_div(&z__1, &c_b2, &wb);
	    zscal_(&i__1, &z__1, &work[2], &c__1);
	    work[1].r = 1., work[1].i = 0.;
	    z_div(&z__1, &wb, &wa);
	    d__1 = z__1.r;
	    tau.r = d__1, tau.i = 0.;
	}

/*        apply random reflection to A(i:n,i:n) from the left   
          and the right   

          compute  y := tau * A * conjg(u) */

	i__1 = *n - i + 1;
	zlacgv_slu(&i__1, &work[1], &c__1);
	i__1 = *n - i + 1;
	zsymv_("Lower", &i__1, &tau, &a[i + i * a_dim1], lda, &work[1], &c__1,
		 &c_b1, &work[*n + 1], &c__1);
	i__1 = *n - i + 1;
	zlacgv_slu(&i__1, &work[1], &c__1);

/*        compute  v := y - 1/2 * tau * ( u, y ) * u */

	z__3.r = -.5, z__3.i = 0.;
	z__2.r = z__3.r * tau.r - z__3.i * tau.i, z__2.i = z__3.r * tau.i + 
		z__3.i * tau.r;
	i__1 = *n - i + 1;
	zdotc_(&z__4, &i__1, &work[1], &c__1, &work[*n + 1], &c__1);
	z__1.r = z__2.r * z__4.r - z__2.i * z__4.i, z__1.i = z__2.r * z__4.i 
		+ z__2.i * z__4.r;
	alpha.r = z__1.r, alpha.i = z__1.i;
	i__1 = *n - i + 1;
	zaxpy_(&i__1, &alpha, &work[1], &c__1, &work[*n + 1], &c__1);

/*        apply the transformation as a rank-2 update to A(i:n,i:n)   

          CALL ZSYR2( 'Lower', N-I+1, -ONE, WORK, 1, WORK( N+1 ), 1, 
  
          $               A( I, I ), LDA ) */

	i__1 = *n;
	for (jj = i; jj <= i__1; ++jj) {
	    i__2 = *n;
	    for (ii = jj; ii <= i__2; ++ii) {
		i__3 = ii + jj * a_dim1;
		i__4 = ii + jj * a_dim1;
		i__5 = ii - i + 1;
		i__6 = *n + jj - i + 1;
		z__3.r = work[i__5].r * work[i__6].r - work[i__5].i * work[
			i__6].i, z__3.i = work[i__5].r * work[i__6].i + work[
			i__5].i * work[i__6].r;
		z__2.r = a[i__4].r - z__3.r, z__2.i = a[i__4].i - z__3.i;
		i__7 = *n + ii - i + 1;
		i__8 = jj - i + 1;
		z__4.r = work[i__7].r * work[i__8].r - work[i__7].i * work[
			i__8].i, z__4.i = work[i__7].r * work[i__8].i + work[
			i__7].i * work[i__8].r;
		z__1.r = z__2.r - z__4.r, z__1.i = z__2.i - z__4.i;
		a[i__3].r = z__1.r, a[i__3].i = z__1.i;
/* L40: */
	    }
/* L50: */
	}
/* L60: */
    }

/*     Reduce number of subdiagonals to K */

    i__1 = *n - 1 - *k;
    for (i = 1; i <= i__1; ++i) {

/*        generate reflection to annihilate A(k+i+1:n,i) */

	i__2 = *n - *k - i + 1;
	wn = dznrm2_(&i__2, &a[*k + i + i * a_dim1], &c__1);
	d__1 = wn / z_abs(&a[*k + i + i * a_dim1]);
	i__2 = *k + i + i * a_dim1;
	z__1.r = d__1 * a[i__2].r, z__1.i = d__1 * a[i__2].i;
	wa.r = z__1.r, wa.i = z__1.i;
	if (wn == 0.) {
	    tau.r = 0., tau.i = 0.;
	} else {
	    i__2 = *k + i + i * a_dim1;
	    z__1.r = a[i__2].r + wa.r, z__1.i = a[i__2].i + wa.i;
	    wb.r = z__1.r, wb.i = z__1.i;
	    i__2 = *n - *k - i;
	    z_div(&z__1, &c_b2, &wb);
	    zscal_(&i__2, &z__1, &a[*k + i + 1 + i * a_dim1], &c__1);
	    i__2 = *k + i + i * a_dim1;
	    a[i__2].r = 1., a[i__2].i = 0.;
	    z_div(&z__1, &wb, &wa);
	    d__1 = z__1.r;
	    tau.r = d__1, tau.i = 0.;
	}

/*        apply reflection to A(k+i:n,i+1:k+i-1) from the left */

	i__2 = *n - *k - i + 1;
	i__3 = *k - 1;
	zgemv_("Conjugate transpose", &i__2, &i__3, &c_b2, &a[*k + i + (i + 1)
		 * a_dim1], lda, &a[*k + i + i * a_dim1], &c__1, &c_b1, &work[
		1], &c__1);
	i__2 = *n - *k - i + 1;
	i__3 = *k - 1;
	z__1.r = -tau.r, z__1.i = -tau.i;
	zgerc_(&i__2, &i__3, &z__1, &a[*k + i + i * a_dim1], &c__1, &work[1], 
		&c__1, &a[*k + i + (i + 1) * a_dim1], lda);

/*        apply reflection to A(k+i:n,k+i:n) from the left and the rig
ht   

          compute  y := tau * A * conjg(u) */

	i__2 = *n - *k - i + 1;
	zlacgv_slu(&i__2, &a[*k + i + i * a_dim1], &c__1);
	i__2 = *n - *k - i + 1;
	zsymv_("Lower", &i__2, &tau, &a[*k + i + (*k + i) * a_dim1], lda, &a[*
		k + i + i * a_dim1], &c__1, &c_b1, &work[1], &c__1);
	i__2 = *n - *k - i + 1;
	zlacgv_slu(&i__2, &a[*k + i + i * a_dim1], &c__1);

/*        compute  v := y - 1/2 * tau * ( u, y ) * u */

	z__3.r = -.5, z__3.i = 0.;
	z__2.r = z__3.r * tau.r - z__3.i * tau.i, z__2.i = z__3.r * tau.i + 
		z__3.i * tau.r;
	i__2 = *n - *k - i + 1;
	zdotc_(&z__4, &i__2, &a[*k + i + i * a_dim1], &c__1, &work[1], &c__1);
	z__1.r = z__2.r * z__4.r - z__2.i * z__4.i, z__1.i = z__2.r * z__4.i 
		+ z__2.i * z__4.r;
	alpha.r = z__1.r, alpha.i = z__1.i;
	i__2 = *n - *k - i + 1;
	zaxpy_(&i__2, &alpha, &a[*k + i + i * a_dim1], &c__1, &work[1], &c__1)
		;

/*        apply symmetric rank-2 update to A(k+i:n,k+i:n)   

          CALL ZSYR2( 'Lower', N-K-I+1, -ONE, A( K+I, I ), 1, WORK, 1,
   
          $               A( K+I, K+I ), LDA ) */

	i__2 = *n;
	for (jj = *k + i; jj <= i__2; ++jj) {
	    i__3 = *n;
	    for (ii = jj; ii <= i__3; ++ii) {
		i__4 = ii + jj * a_dim1;
		i__5 = ii + jj * a_dim1;
		i__6 = ii + i * a_dim1;
		i__7 = jj - *k - i + 1;
		z__3.r = a[i__6].r * work[i__7].r - a[i__6].i * work[i__7].i, 
			z__3.i = a[i__6].r * work[i__7].i + a[i__6].i * work[
			i__7].r;
		z__2.r = a[i__5].r - z__3.r, z__2.i = a[i__5].i - z__3.i;
		i__8 = ii - *k - i + 1;
		i__9 = jj + i * a_dim1;
		z__4.r = work[i__8].r * a[i__9].r - work[i__8].i * a[i__9].i, 
			z__4.i = work[i__8].r * a[i__9].i + work[i__8].i * a[
			i__9].r;
		z__1.r = z__2.r - z__4.r, z__1.i = z__2.i - z__4.i;
		a[i__4].r = z__1.r, a[i__4].i = z__1.i;
/* L70: */
	    }
/* L80: */
	}

	i__2 = *k + i + i * a_dim1;
	z__1.r = -wa.r, z__1.i = -wa.i;
	a[i__2].r = z__1.r, a[i__2].i = z__1.i;
	i__2 = *n;
	for (j = *k + i + 1; j <= i__2; ++j) {
	    i__3 = j + i * a_dim1;
	    a[i__3].r = 0., a[i__3].i = 0.;
/* L90: */
	}
/* L100: */
    }

/*     Store full symmetric matrix */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i = j + 1; i <= i__2; ++i) {
	    i__3 = j + i * a_dim1;
	    i__4 = i + j * a_dim1;
	    a[i__3].r = a[i__4].r, a[i__3].i = a[i__4].i;
/* L110: */
	}
/* L120: */
    }
    return 0;

/*     End of ZLAGSY */

}